

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

int __thiscall Process::yesOrNo(Process *this,double probability)

{
  uint uVar1;
  result_type_conflict1 rVar2;
  random_device rd;
  mt19937 mersenne;
  uniform_real_distribution<double> local_2728;
  random_device local_2718;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_1390;
  
  yesOrNo::sum = yesOrNo::sum + probability;
  std::random_device::random_device(&local_2718);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_1390,(ulong)uVar1);
  local_2728._M_param._M_a = 0.0;
  local_2728._M_param._M_b = 1.0;
  rVar2 = std::uniform_real_distribution<double>::operator()(&local_2728,&local_1390);
  std::random_device::~random_device(&local_2718);
  return (int)(rVar2 <= probability);
}

Assistant:

int Process::yesOrNo(double probability){
    static double sum = 0;
    sum += probability;
    std::random_device rd;
    std::mt19937 mersenne(rd());
    std::uniform_real_distribution<> urd(0, 1);
    auto a = urd(mersenne);
    return a <= probability ? 1 : 0;
}